

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

double __thiscall llvm::frexp(llvm *this,double __x,int *__exponent)

{
  int *__exponent_00;
  fltSemantics *Semantics;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar1;
  undefined1 auStack_68 [8];
  __uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_> local_60;
  IEEEFloat local_58;
  IEEEFloat local_40;
  
  __exponent_00 = __exponent + 2;
  if (*(undefined1 **)(__exponent + 2) == semPPCDoubleDouble) {
    detail::frexp((detail *)auStack_68,__x,__exponent_00);
    APFloat::APFloat((APFloat *)this,(DoubleAPFloat *)auStack_68,*(fltSemantics **)__exponent_00);
    dVar1 = extraout_XMM0_Qa_00;
    if ((_Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>)
        local_60._M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl != (APFloat *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_60,
                 (APFloat *)
                 local_60._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
      dVar1 = extraout_XMM0_Qa_01;
    }
  }
  else {
    detail::frexp(__x,(int *)&local_58);
    Semantics = *(fltSemantics **)__exponent_00;
    detail::IEEEFloat::IEEEFloat(&local_40,&local_58);
    APFloat::Storage::Storage((Storage *)(this + 8),&local_40,Semantics);
    detail::IEEEFloat::~IEEEFloat(&local_40);
    detail::IEEEFloat::~IEEEFloat(&local_58);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

inline APFloat frexp(const APFloat &X, int &Exp, APFloat::roundingMode RM) {
  if (APFloat::usesLayout<detail::IEEEFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.IEEE, Exp, RM), X.getSemantics());
  if (APFloat::usesLayout<detail::DoubleAPFloat>(X.getSemantics()))
    return APFloat(frexp(X.U.Double, Exp, RM), X.getSemantics());
  llvm_unreachable("Unexpected semantics");
}